

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockSetControlUserValue
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,double pValue,
          zes_pending_action_t *pPendingAction)

{
  zes_pfnOverclockSetControlUserValue_t pfnSetControlUserValue;
  ze_result_t result;
  zes_pending_action_t *pPendingAction_local;
  double pValue_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnSetControlUserValue._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb58 != (code *)0x0) {
    pfnSetControlUserValue._4_4_ =
         (*DAT_0011cb58)(pValue,hDomainHandle,DomainControl,pPendingAction);
  }
  return pfnSetControlUserValue._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockSetControlUserValue(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Domain Control.
        double pValue,                                  ///< [in] The new value of the control. The units and format of the value
                                                        ///< depend on the control type.
        zes_pending_action_t* pPendingAction            ///< [out] Pending overclock setting.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetControlUserValue = context.zesDdiTable.Overclock.pfnSetControlUserValue;
        if( nullptr != pfnSetControlUserValue )
        {
            result = pfnSetControlUserValue( hDomainHandle, DomainControl, pValue, pPendingAction );
        }
        else
        {
            // generic implementation
        }

        return result;
    }